

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_dec.c
# Opt level: O0

int EmitRescaledAlphaYUV(VP8Io *io,WebPDecParams *p,int expected_num_lines_out)

{
  long lVar1;
  int stride;
  long *plVar2;
  uint8_t *src;
  long *in_RSI;
  long in_RDI;
  int num_lines_out;
  uint8_t *dst_y;
  uint8_t *dst_a;
  WebPYUVABuffer *buf;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  WebPRescaler *in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  
  lVar1 = *in_RSI;
  plVar2 = (long *)(lVar1 + 0x10);
  if (*(long *)(in_RDI + 0x98) == 0) {
    if (*(long *)(lVar1 + 0x28) != 0) {
      FillAlphaPlane((uint8_t *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                     in_stack_ffffffffffffffb8,0);
    }
  }
  else {
    src = (uint8_t *)(*plVar2 + (long)(int)in_RSI[4] * (long)*(int *)(lVar1 + 0x30));
    stride = Rescale(src,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
                     in_stack_ffffffffffffffc0);
    if (0 < stride) {
      WebPMultRows(src,stride,(uint8_t *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,1,0,
                   (int)plVar2);
    }
  }
  return 0;
}

Assistant:

static int EmitRescaledAlphaYUV(const VP8Io* const io, WebPDecParams* const p,
                                int expected_num_lines_out) {
  const WebPYUVABuffer* const buf = &p->output->u.YUVA;
  uint8_t* const dst_a = buf->a + (size_t)p->last_y * buf->a_stride;
  if (io->a != NULL) {
    uint8_t* const dst_y = buf->y + (size_t)p->last_y * buf->y_stride;
    const int num_lines_out = Rescale(io->a, io->width, io->mb_h, p->scaler_a);
    assert(expected_num_lines_out == num_lines_out);
    if (num_lines_out > 0) {   // unmultiply the Y
      WebPMultRows(dst_y, buf->y_stride, dst_a, buf->a_stride,
                   p->scaler_a->dst_width, num_lines_out, 1);
    }
  } else if (buf->a != NULL) {
    // the user requested alpha, but there is none, set it to opaque.
    assert(p->last_y + expected_num_lines_out <= io->scaled_height);
    FillAlphaPlane(dst_a, io->scaled_width, expected_num_lines_out,
                   buf->a_stride);
  }
  return 0;
}